

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O2

vec3 * random_unit_vector(void)

{
  vec3 *in_RDI;
  double dVar1;
  vec3 p;
  double local_28;
  double dStack_20;
  double local_18;
  
  do {
    do {
      vec3::random();
      dVar1 = local_18 * local_18 + local_28 * local_28 + dStack_20 * dStack_20;
    } while (dVar1 <= 1e-160);
  } while (1.0 < dVar1);
  dVar1 = 1.0 / SQRT(dVar1);
  in_RDI->e[0] = dVar1 * local_28;
  in_RDI->e[1] = dVar1 * dStack_20;
  in_RDI->e[2] = local_18 * dVar1;
  return in_RDI;
}

Assistant:

inline vec3 random_unit_vector() {
    while (true) {
        auto p = vec3::random(-1,1);
        auto lensq = p.length_squared();
        if (1e-160 < lensq && lensq <= 1.0)
            return p / sqrt(lensq);
    }
}